

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O1

Voice * __thiscall Synthesizer::SynthesizerChannel::AllocateVoice(SynthesizerChannel *this,int key)

{
  Voice *pVVar1;
  int n;
  long lVar2;
  long lVar3;
  Voice *pVVar4;
  
  if (this->keys[key] != (Voice *)0x0) {
    return this->keys[key];
  }
  lVar2 = (long)this->numvoices;
  if (lVar2 < 0x20) {
    this->numvoices = this->numvoices + 1;
    pVVar1 = this->voicepool[lVar2];
  }
  else {
    lVar3 = 1;
    pVVar4 = this->voicepool[0];
    do {
      pVVar1 = this->voicepool[lVar3];
      if (pVVar4->aenv * pVVar4->fenv <= pVVar1->aenv * pVVar1->fenv) {
        pVVar1 = pVVar4;
      }
      lVar3 = lVar3 + 1;
      pVVar4 = pVVar1;
    } while (lVar2 != lVar3);
    lVar2 = 0;
    do {
      if (this->keys[lVar2] == pVVar1) {
        this->keys[lVar2] = (Voice *)0x0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x80);
  }
  this->keys[key] = pVVar1;
  return pVVar1;
}

Assistant:

Voice* AllocateVoice(int key)
        {
            Voice* v = keys[key];
            if (v != NULL)
                return v;

            if (numvoices < MAXVOICES)
                v = voicepool[numvoices++];
            else
            {
                v = voicepool[0];
                for (int i = 1; i < numvoices; i++)
                {
                    Voice* q = voicepool[i];
                    if (q->GetImportance() < v->GetImportance())
                        v = q;
                }
                for (int n = 0; n < 128; n++)
                    if (keys[n] == v)
                        keys[n] = NULL;
            }

            keys[key] = v;
            return v;
        }